

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O0

AttributeCell __thiscall nesvis::PpuHelper::get_attribute_cell(PpuHelper *this,int x,int y)

{
  int iVar1;
  IMmu *pIVar2;
  ushort uVar3;
  int iVar4;
  uint8_t palette;
  uint8_t attr_shifted;
  uint8_t shift;
  int y2;
  int x2;
  uint8_t attribute_raw;
  uint16_t address;
  int attribute_y;
  int attribute_x;
  int y_local;
  int x_local;
  PpuHelper *this_local;
  
  iVar1 = x;
  if (x < 0) {
    iVar1 = x + 3;
  }
  iVar4 = y;
  if (y < 0) {
    iVar4 = y + 3;
  }
  uVar3 = (short)(iVar1 >> 2) + 0x23c0 + (short)(iVar4 >> 2) * 8;
  pIVar2 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
  iVar1 = (*pIVar2->_vptr_IMmu[3])(pIVar2,(ulong)uVar3);
  return (AttributeCell)
         (CONCAT24(uVar3,CONCAT13(this_local._5_1_,
                                  CONCAT12((byte)iVar1 >>
                                           (char)((y / 2 & 1U) << 2) + ((byte)(x / 2) & 1) * '\x02',
                                           (ushort)(byte)iVar1))) & 0xffffff03ffff);
}

Assistant:

PpuHelper::AttributeCell PpuHelper::get_attribute_cell(int x, int y) {
    // TODO(jn) handle mirroring, this will not work
    // Each attribute cell has 4 tiles in it
    const int attribute_x = x / 4;
    const int attribute_y = y / 4;
    const uint16_t address = 0x23C0 + attribute_y * 8 + attribute_x;
    const uint8_t attribute_raw = nes_->ppu_mmu().read_byte(address);

    // Each attribute byte controls 2 tiles
    // Unpack: value = (bottomright << 6) | (bottomleft << 4) |
    //                 (topright << 2)    | (topleft << 0)
    const int x2 = x / 2;
    const int y2 = y / 2;
    const uint8_t shift = 2u * (x2 % 2u) + 4u * (y2 % 2u);
    const uint8_t attr_shifted = attribute_raw >> shift;
    const uint8_t palette = attr_shifted & 0b11u;

    return {.attribute = attribute_raw, .palette = palette, .address = address};
}